

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

void __thiscall QKeySequenceEdit::keyReleaseEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  QKeySequenceEditPrivate *this_00;
  
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  if (this_00->prevKey == *(int *)(e + 0x40)) {
    if (this_00->keyNum < this_00->maximumSequenceLength) {
      QBasicTimer::start(&this_00->releaseTimer,1000000000,1,this);
    }
    else {
      QKeySequenceEditPrivate::finishEditing(this_00);
    }
  }
  e[0xc] = (QKeyEvent)0x1;
  return;
}

Assistant:

void QKeySequenceEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->prevKey == e->key()) {
        if (d->keyNum < d->maximumSequenceLength)
            d->releaseTimer.start(1s, this);
        else
            d->finishEditing();
    }
    e->accept();
}